

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int multiSelect(Parse *pParse,Select *p,SelectDest *pDest)

{
  u8 uVar1;
  short sVar2;
  Select *pSVar3;
  LogEst LVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  Parse *p_00;
  Select *pSVar10;
  char *pcVar11;
  KeyInfo *p_01;
  CollSeq *pCVar12;
  void *in_RDX;
  Select *in_RSI;
  Parse *in_RDI;
  long in_FS_OFFSET;
  int addr_3;
  int nCol;
  CollSeq **apColl;
  Select *pLoop;
  KeyInfo *pKeyInfo;
  int i;
  int r1;
  int addr_2;
  Expr *pLimit_1;
  int iStart_1;
  int iBreak_1;
  int iCont_1;
  int tab2;
  int tab1;
  int iStart;
  int iBreak;
  int iCont;
  int addr_1;
  Expr *pLimit;
  int priorOp;
  u8 op;
  int unionTab;
  int addr;
  sqlite3 *db;
  Select *pDelete;
  Vdbe *v;
  Select *pPrior;
  int rc;
  SelectDest intersectdest;
  SelectDest uniondest;
  int nLimit;
  SelectDest dest;
  int in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  int in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe84;
  int in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  Parse *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  Parse *in_stack_fffffffffffffea0;
  Parse *in_stack_fffffffffffffea8;
  Parse *pParse_00;
  CollSeq **local_140;
  Select *local_138;
  int local_124;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  SortCtx *in_stack_ffffffffffffff18;
  Expr *pEVar13;
  uint in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  sqlite3 *pParse_01;
  Select *local_c8;
  int in_stack_ffffffffffffff50;
  int local_ac;
  int local_8c;
  undefined1 local_88 [4];
  int local_84;
  SelectDest *in_stack_ffffffffffffff80;
  Select *in_stack_ffffffffffffff88;
  Parse *in_stack_ffffffffffffff90;
  SelectDest local_60;
  int local_34;
  char local_30 [4];
  int local_2c;
  undefined4 local_24;
  undefined4 local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_30,0xaa,0x28);
  local_c8 = (Select *)0x0;
  pParse_01 = in_RDI->db;
  pSVar3 = in_RSI->pPrior;
  memcpy(local_30,in_RDX,0x28);
  p_00 = (Parse *)sqlite3GetVdbe((Parse *)CONCAT44(in_stack_fffffffffffffe7c,
                                                   in_stack_fffffffffffffe78));
  local_138 = in_RSI;
  if (local_30[0] == '\f') {
    sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                      in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78,0);
    local_30[0] = '\x0e';
    local_138 = in_RSI;
  }
  if (((local_138->selFlags & 0x400) != 0) &&
     (local_ac = multiSelectValues(in_stack_fffffffffffffea8,(Select *)in_stack_fffffffffffffea0,
                                   (SelectDest *)
                                   CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)),
     -1 < local_ac)) goto LAB_001e8faf;
  local_ac = 0;
  if (((local_138->selFlags & 0x2000) == 0) || (iVar5 = hasAnchor(local_138), iVar5 == 0)) {
    if (local_138->pOrderBy != (ExprList *)0x0) {
      local_8c = multiSelectOrderBy(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                                    in_stack_ffffffffffffff80);
      goto LAB_001e9008;
    }
    if (pSVar3->pPrior == (Select *)0x0) {
      sqlite3VdbeExplain(in_RDI,'\x01',"COMPOUND QUERY");
      sqlite3VdbeExplain(in_RDI,'\x01',"LEFT-MOST SUBQUERY");
    }
    uVar1 = local_138->op;
    if (uVar1 == 0x87) {
LAB_001e8551:
      in_stack_ffffffffffffff24 = in_stack_ffffffffffffff24 & 0xffffff;
      iVar9 = -0x55555556;
      memset(&local_60,0xaa,0x28);
      iVar5 = local_2c;
      pParse_00 = in_RDI;
      if (local_30[0] != '\x01') {
        iVar5 = in_RDI->nTab;
        in_RDI->nTab = iVar5 + 1;
        iVar9 = sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffe84,
                                                   in_stack_fffffffffffffe80),
                                  in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78,0);
        local_138->addrOpenEphm[0] = iVar9;
        pSVar10 = findRightmost(local_138);
        pSVar10->selFlags = pSVar10->selFlags | 0x20;
        pParse_00 = in_RDI;
      }
      sqlite3SelectDestInit(&local_60,1,iVar5);
      local_ac = sqlite3Select((Parse *)intersectdest.pOrderBy,(Select *)intersectdest.zAffSdst,
                               (SelectDest *)intersectdest._16_8_);
      if (local_ac == 0) {
        if (local_138->op == 0x89) {
          iVar8 = CONCAT13(2,(int3)in_stack_ffffffffffffff24);
        }
        else {
          iVar8 = CONCAT13(1,(int3)in_stack_ffffffffffffff24);
        }
        local_138->pPrior = (Select *)0x0;
        pEVar13 = local_138->pLimit;
        local_138->pLimit = (Expr *)0x0;
        local_60.eDest = (u8)((uint)iVar8 >> 0x18);
        in_RDI = pParse_00;
        pcVar11 = sqlite3SelectOpName((uint)local_138->op);
        sqlite3VdbeExplain(pParse_00,'\x01',"%s USING TEMP B-TREE",pcVar11);
        local_ac = sqlite3Select((Parse *)intersectdest.pOrderBy,(Select *)intersectdest.zAffSdst,
                                 (SelectDest *)intersectdest._16_8_);
        local_c8 = local_138->pPrior;
        local_138->pPrior = pSVar3;
        local_138->pOrderBy = (ExprList *)0x0;
        if (local_138->op == 0x87) {
          LVar4 = sqlite3LogEstAdd(local_138->nSelectRow,pSVar3->nSelectRow);
          local_138->nSelectRow = LVar4;
        }
        sqlite3ExprDelete((sqlite3 *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                          (Expr *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        local_138->pLimit = pEVar13;
        local_138->iLimit = 0;
        local_138->iOffset = 0;
        if ((local_30[0] != '\x01') && (pParse_01->mallocFailed == '\0')) {
          iVar6 = sqlite3VdbeMakeLabel(in_RDI);
          iVar7 = sqlite3VdbeMakeLabel(in_RDI);
          computeLimitRegisters
                    (in_stack_fffffffffffffea0,
                     (Select *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                     (int)((ulong)in_stack_fffffffffffffe90 >> 0x20));
          sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                            in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78,0);
          in_stack_fffffffffffffe80 = iVar6;
          in_stack_fffffffffffffe78 = iVar7;
          iVar6 = sqlite3VdbeCurrentAddr((Vdbe *)p_00);
          selectInnerLoop((Parse *)pParse_01,(Select *)CONCAT44(in_stack_ffffffffffffff2c,iVar5),
                          iVar8,(SortCtx *)pEVar13,
                          (DistinctCtx *)CONCAT44(iVar9,in_stack_fffffffffffffe78),
                          (SelectDest *)CONCAT44(in_stack_fffffffffffffe80,iVar6),
                          in_stack_ffffffffffffff50,(int)in_RDX);
          sqlite3VdbeResolveLabel((Vdbe *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
          sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                            in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78,0);
          sqlite3VdbeResolveLabel((Vdbe *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
          sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                            in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78,0);
        }
LAB_001e8d8e:
        if (local_138->pNext == (Select *)0x0) {
          sqlite3VdbeExplainPop((Parse *)0x1e8daa);
        }
        goto LAB_001e8dae;
      }
    }
    else if (uVar1 == 0x88) {
      iVar5 = 0;
      local_34 = 0;
      pSVar3->iLimit = local_138->iLimit;
      pSVar3->iOffset = local_138->iOffset;
      pSVar3->pLimit = local_138->pLimit;
      local_ac = sqlite3Select((Parse *)intersectdest.pOrderBy,(Select *)intersectdest.zAffSdst,
                               (SelectDest *)intersectdest._16_8_);
      pSVar3->pLimit = (Expr *)0x0;
      if (local_ac == 0) {
        local_138->pPrior = (Select *)0x0;
        local_138->iLimit = pSVar3->iLimit;
        local_138->iOffset = pSVar3->iOffset;
        if ((local_138->iLimit != 0) &&
           (iVar5 = sqlite3VdbeAddOp1((Vdbe *)CONCAT44(in_stack_fffffffffffffe84,
                                                       in_stack_fffffffffffffe80),
                                      in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
           local_138->iOffset != 0)) {
          sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                            (int)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                            (int)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
                            in_stack_fffffffffffffe88);
        }
        sqlite3VdbeExplain(in_RDI,'\x01',"UNION ALL");
        local_ac = sqlite3Select((Parse *)intersectdest.pOrderBy,(Select *)intersectdest.zAffSdst,
                                 (SelectDest *)intersectdest._16_8_);
        local_c8 = local_138->pPrior;
        local_138->pPrior = pSVar3;
        LVar4 = sqlite3LogEstAdd(local_138->nSelectRow,pSVar3->nSelectRow);
        local_138->nSelectRow = LVar4;
        if ((((local_138->pLimit != (Expr *)0x0) &&
             (iVar9 = sqlite3ExprIsInteger
                                ((Expr *)in_stack_fffffffffffffea0,
                                 (int *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98
                                                ),in_stack_fffffffffffffe90), iVar9 != 0)) &&
            (0 < local_34)) &&
           (sVar2 = local_138->nSelectRow, LVar4 = sqlite3LogEst((long)local_34), LVar4 < sVar2)) {
          LVar4 = sqlite3LogEst((long)local_34);
          local_138->nSelectRow = LVar4;
        }
        if (iVar5 != 0) {
          sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                              in_stack_fffffffffffffe7c);
        }
        goto LAB_001e8d8e;
      }
    }
    else {
      if (uVar1 == 0x89) goto LAB_001e8551;
      memset(local_88,0xaa,0x28);
      iVar5 = in_RDI->nTab;
      in_RDI->nTab = iVar5 + 1;
      iVar9 = in_RDI->nTab;
      in_RDI->nTab = iVar9 + 1;
      iVar8 = sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80
                                                ),in_stack_fffffffffffffe7c,
                                in_stack_fffffffffffffe78,0);
      local_138->addrOpenEphm[0] = iVar8;
      pSVar10 = findRightmost(local_138);
      pSVar10->selFlags = pSVar10->selFlags | 0x20;
      sqlite3SelectDestInit((SelectDest *)local_88,1,iVar5);
      local_ac = sqlite3Select((Parse *)intersectdest.pOrderBy,(Select *)intersectdest.zAffSdst,
                               (SelectDest *)intersectdest._16_8_);
      if (local_ac == 0) {
        in_stack_fffffffffffffea0 = in_RDI;
        iVar5 = sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffe84,
                                                   in_stack_fffffffffffffe80),
                                  in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78,0);
        local_138->addrOpenEphm[1] = iVar5;
        local_138->pPrior = (Select *)0x0;
        pEVar13 = local_138->pLimit;
        local_138->pLimit = (Expr *)0x0;
        in_RDI = in_stack_fffffffffffffea0;
        local_84 = iVar9;
        pcVar11 = sqlite3SelectOpName((uint)local_138->op);
        sqlite3VdbeExplain(in_stack_fffffffffffffea0,'\x01',"%s USING TEMP B-TREE",pcVar11);
        local_ac = sqlite3Select((Parse *)intersectdest.pOrderBy,(Select *)intersectdest.zAffSdst,
                                 (SelectDest *)intersectdest._16_8_);
        local_c8 = local_138->pPrior;
        local_138->pPrior = pSVar3;
        if (pSVar3->nSelectRow < local_138->nSelectRow) {
          local_138->nSelectRow = pSVar3->nSelectRow;
        }
        sqlite3ExprDelete((sqlite3 *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                          (Expr *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        local_138->pLimit = pEVar13;
        if (local_ac == 0) {
          iVar5 = sqlite3VdbeMakeLabel(in_RDI);
          iVar9 = sqlite3VdbeMakeLabel(in_RDI);
          computeLimitRegisters
                    (in_stack_fffffffffffffea0,
                     (Select *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                     (int)((ulong)in_stack_fffffffffffffe90 >> 0x20));
          sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                            in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78,0);
          iVar8 = sqlite3GetTempReg(in_RDI);
          sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                            in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78,0);
          sqlite3VdbeAddOp4Int
                    ((Vdbe *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                     (int)((ulong)in_stack_fffffffffffffe90 >> 0x20),(int)in_stack_fffffffffffffe90,
                     in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88,in_stack_fffffffffffffe84);
          in_stack_fffffffffffffe80 = iVar5;
          in_stack_fffffffffffffe78 = iVar9;
          sqlite3ReleaseTempReg(in_RDI,iVar8);
          selectInnerLoop((Parse *)pParse_01,
                          (Select *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                          in_stack_ffffffffffffff24,in_stack_ffffffffffffff18,
                          (DistinctCtx *)
                          CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                          (SelectDest *)
                          CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                          in_stack_ffffffffffffff50,(int)in_RDX);
          sqlite3VdbeResolveLabel((Vdbe *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
          sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                            in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78,0);
          sqlite3VdbeResolveLabel((Vdbe *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
          sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                            in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78,0);
          sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                            in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78,0);
        }
        goto LAB_001e8d8e;
      }
    }
  }
  else {
    generateWithRecursiveQuery
              ((Parse *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (Select *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
               (SelectDest *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
LAB_001e8dae:
    if ((in_RDI->nErr == 0) && ((local_138->selFlags & 0x20) != 0)) {
      iVar5 = local_138->pEList->nExpr;
      p_01 = sqlite3KeyInfoAlloc((sqlite3 *)
                                 CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                                 in_stack_fffffffffffffe84,in_stack_fffffffffffffe80);
      if (p_01 == (KeyInfo *)0x0) {
        local_ac = 7;
      }
      else {
        local_140 = p_01->aColl;
        for (local_124 = 0; local_124 < iVar5; local_124 = local_124 + 1) {
          pCVar12 = multiSelectCollSeq(in_stack_fffffffffffffe90,
                                       (Select *)
                                       CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88)
                                       ,in_stack_fffffffffffffe84);
          *local_140 = pCVar12;
          if (*local_140 == (CollSeq *)0x0) {
            *local_140 = (CollSeq *)pParse_01->pDfltColl;
          }
          local_140 = local_140 + 1;
        }
        for (; local_138 != (Select *)0x0; local_138 = local_138->pPrior) {
          for (local_124 = 0;
              (local_124 < 2 && (iVar5 = local_138->addrOpenEphm[local_124], -1 < iVar5));
              local_124 = local_124 + 1) {
            sqlite3VdbeChangeP2((Vdbe *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80
                                                ),in_stack_fffffffffffffe7c,
                                in_stack_fffffffffffffe78);
            in_stack_fffffffffffffe90 = p_00;
            sqlite3KeyInfoRef(p_01);
            sqlite3VdbeChangeP4((Vdbe *)in_stack_fffffffffffffea0,iVar5,
                                (char *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
            local_138->addrOpenEphm[local_124] = -1;
          }
        }
        sqlite3KeyInfoUnref((KeyInfo *)0x1e8fad);
      }
    }
  }
LAB_001e8faf:
  *(undefined4 *)((long)in_RDX + 0xc) = local_24;
  *(undefined4 *)((long)in_RDX + 0x10) = local_20;
  if (local_c8 != (Select *)0x0) {
    sqlite3ParserAddCleanup
              (in_stack_fffffffffffffe90,
               (_func_void_sqlite3_ptr_void_ptr *)
               CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
               (void *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  }
  local_8c = local_ac;
LAB_001e9008:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_8c;
}

Assistant:

static int multiSelect(
  Parse *pParse,        /* Parsing context */
  Select *p,            /* The right-most of SELECTs to be coded */
  SelectDest *pDest     /* What to do with query results */
){
  int rc = SQLITE_OK;   /* Success code from a subroutine */
  Select *pPrior;       /* Another SELECT immediately to our left */
  Vdbe *v;              /* Generate code to this VDBE */
  SelectDest dest;      /* Alternative data destination */
  Select *pDelete = 0;  /* Chain of simple selects to delete */
  sqlite3 *db;          /* Database connection */

  /* Make sure there is no ORDER BY or LIMIT clause on prior SELECTs.  Only
  ** the last (right-most) SELECT in the series may have an ORDER BY or LIMIT.
  */
  assert( p && p->pPrior );  /* Calling function guarantees this much */
  assert( (p->selFlags & SF_Recursive)==0 || p->op==TK_ALL || p->op==TK_UNION );
  assert( p->selFlags & SF_Compound );
  db = pParse->db;
  pPrior = p->pPrior;
  dest = *pDest;
  assert( pPrior->pOrderBy==0 );
  assert( pPrior->pLimit==0 );

  v = sqlite3GetVdbe(pParse);
  assert( v!=0 );  /* The VDBE already created by calling function */

  /* Create the destination temporary table if necessary
  */
  if( dest.eDest==SRT_EphemTab ){
    assert( p->pEList );
    sqlite3VdbeAddOp2(v, OP_OpenEphemeral, dest.iSDParm, p->pEList->nExpr);
    dest.eDest = SRT_Table;
  }

  /* Special handling for a compound-select that originates as a VALUES clause.
  */
  if( p->selFlags & SF_MultiValue ){
    rc = multiSelectValues(pParse, p, &dest);
    if( rc>=0 ) goto multi_select_end;
    rc = SQLITE_OK;
  }

  /* Make sure all SELECTs in the statement have the same number of elements
  ** in their result sets.
  */
  assert( p->pEList && pPrior->pEList );
  assert( p->pEList->nExpr==pPrior->pEList->nExpr );

#ifndef SQLITE_OMIT_CTE
  if( (p->selFlags & SF_Recursive)!=0 && hasAnchor(p) ){
    generateWithRecursiveQuery(pParse, p, &dest);
  }else
#endif

  /* Compound SELECTs that have an ORDER BY clause are handled separately.
  */
  if( p->pOrderBy ){
    return multiSelectOrderBy(pParse, p, pDest);
  }else{

#ifndef SQLITE_OMIT_EXPLAIN
    if( pPrior->pPrior==0 ){
      ExplainQueryPlan((pParse, 1, "COMPOUND QUERY"));
      ExplainQueryPlan((pParse, 1, "LEFT-MOST SUBQUERY"));
    }
#endif

    /* Generate code for the left and right SELECT statements.
    */
    switch( p->op ){
      case TK_ALL: {
        int addr = 0;
        int nLimit = 0;  /* Initialize to suppress harmless compiler warning */
        assert( !pPrior->pLimit );
        pPrior->iLimit = p->iLimit;
        pPrior->iOffset = p->iOffset;
        pPrior->pLimit = p->pLimit;
        TREETRACE(0x200, pParse, p, ("multiSelect UNION ALL left...\n"));
        rc = sqlite3Select(pParse, pPrior, &dest);
        pPrior->pLimit = 0;
        if( rc ){
          goto multi_select_end;
        }
        p->pPrior = 0;
        p->iLimit = pPrior->iLimit;
        p->iOffset = pPrior->iOffset;
        if( p->iLimit ){
          addr = sqlite3VdbeAddOp1(v, OP_IfNot, p->iLimit); VdbeCoverage(v);
          VdbeComment((v, "Jump ahead if LIMIT reached"));
          if( p->iOffset ){
            sqlite3VdbeAddOp3(v, OP_OffsetLimit,
                              p->iLimit, p->iOffset+1, p->iOffset);
          }
        }
        ExplainQueryPlan((pParse, 1, "UNION ALL"));
        TREETRACE(0x200, pParse, p, ("multiSelect UNION ALL right...\n"));
        rc = sqlite3Select(pParse, p, &dest);
        testcase( rc!=SQLITE_OK );
        pDelete = p->pPrior;
        p->pPrior = pPrior;
        p->nSelectRow = sqlite3LogEstAdd(p->nSelectRow, pPrior->nSelectRow);
        if( p->pLimit
         && sqlite3ExprIsInteger(p->pLimit->pLeft, &nLimit, pParse)
         && nLimit>0 && p->nSelectRow > sqlite3LogEst((u64)nLimit)
        ){
          p->nSelectRow = sqlite3LogEst((u64)nLimit);
        }
        if( addr ){
          sqlite3VdbeJumpHere(v, addr);
        }
        break;
      }
      case TK_EXCEPT:
      case TK_UNION: {
        int unionTab;    /* Cursor number of the temp table holding result */
        u8 op = 0;       /* One of the SRT_ operations to apply to self */
        int priorOp;     /* The SRT_ operation to apply to prior selects */
        Expr *pLimit;    /* Saved values of p->nLimit  */
        int addr;
        SelectDest uniondest;

        testcase( p->op==TK_EXCEPT );
        testcase( p->op==TK_UNION );
        priorOp = SRT_Union;
        if( dest.eDest==priorOp ){
          /* We can reuse a temporary table generated by a SELECT to our
          ** right.
          */
          assert( p->pLimit==0 );      /* Not allowed on leftward elements */
          unionTab = dest.iSDParm;
        }else{
          /* We will need to create our own temporary table to hold the
          ** intermediate results.
          */
          unionTab = pParse->nTab++;
          assert( p->pOrderBy==0 );
          addr = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, unionTab, 0);
          assert( p->addrOpenEphm[0] == -1 );
          p->addrOpenEphm[0] = addr;
          findRightmost(p)->selFlags |= SF_UsesEphemeral;
          assert( p->pEList );
        }


        /* Code the SELECT statements to our left
        */
        assert( !pPrior->pOrderBy );
        sqlite3SelectDestInit(&uniondest, priorOp, unionTab);
        TREETRACE(0x200, pParse, p, ("multiSelect EXCEPT/UNION left...\n"));
        rc = sqlite3Select(pParse, pPrior, &uniondest);
        if( rc ){
          goto multi_select_end;
        }

        /* Code the current SELECT statement
        */
        if( p->op==TK_EXCEPT ){
          op = SRT_Except;
        }else{
          assert( p->op==TK_UNION );
          op = SRT_Union;
        }
        p->pPrior = 0;
        pLimit = p->pLimit;
        p->pLimit = 0;
        uniondest.eDest = op;
        ExplainQueryPlan((pParse, 1, "%s USING TEMP B-TREE",
                          sqlite3SelectOpName(p->op)));
        TREETRACE(0x200, pParse, p, ("multiSelect EXCEPT/UNION right...\n"));
        rc = sqlite3Select(pParse, p, &uniondest);
        testcase( rc!=SQLITE_OK );
        assert( p->pOrderBy==0 );
        pDelete = p->pPrior;
        p->pPrior = pPrior;
        p->pOrderBy = 0;
        if( p->op==TK_UNION ){
          p->nSelectRow = sqlite3LogEstAdd(p->nSelectRow, pPrior->nSelectRow);
        }
        sqlite3ExprDelete(db, p->pLimit);
        p->pLimit = pLimit;
        p->iLimit = 0;
        p->iOffset = 0;

        /* Convert the data in the temporary table into whatever form
        ** it is that we currently need.
        */
        assert( unionTab==dest.iSDParm || dest.eDest!=priorOp );
        assert( p->pEList || db->mallocFailed );
        if( dest.eDest!=priorOp && db->mallocFailed==0 ){
          int iCont, iBreak, iStart;
          iBreak = sqlite3VdbeMakeLabel(pParse);
          iCont = sqlite3VdbeMakeLabel(pParse);
          computeLimitRegisters(pParse, p, iBreak);
          sqlite3VdbeAddOp2(v, OP_Rewind, unionTab, iBreak); VdbeCoverage(v);
          iStart = sqlite3VdbeCurrentAddr(v);
          selectInnerLoop(pParse, p, unionTab,
                          0, 0, &dest, iCont, iBreak);
          sqlite3VdbeResolveLabel(v, iCont);
          sqlite3VdbeAddOp2(v, OP_Next, unionTab, iStart); VdbeCoverage(v);
          sqlite3VdbeResolveLabel(v, iBreak);
          sqlite3VdbeAddOp2(v, OP_Close, unionTab, 0);
        }
        break;
      }
      default: assert( p->op==TK_INTERSECT ); {
        int tab1, tab2;
        int iCont, iBreak, iStart;
        Expr *pLimit;
        int addr;
        SelectDest intersectdest;
        int r1;

        /* INTERSECT is different from the others since it requires
        ** two temporary tables.  Hence it has its own case.  Begin
        ** by allocating the tables we will need.
        */
        tab1 = pParse->nTab++;
        tab2 = pParse->nTab++;
        assert( p->pOrderBy==0 );

        addr = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, tab1, 0);
        assert( p->addrOpenEphm[0] == -1 );
        p->addrOpenEphm[0] = addr;
        findRightmost(p)->selFlags |= SF_UsesEphemeral;
        assert( p->pEList );

        /* Code the SELECTs to our left into temporary table "tab1".
        */
        sqlite3SelectDestInit(&intersectdest, SRT_Union, tab1);
        TREETRACE(0x400, pParse, p, ("multiSelect INTERSECT left...\n"));
        rc = sqlite3Select(pParse, pPrior, &intersectdest);
        if( rc ){
          goto multi_select_end;
        }

        /* Code the current SELECT into temporary table "tab2"
        */
        addr = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, tab2, 0);
        assert( p->addrOpenEphm[1] == -1 );
        p->addrOpenEphm[1] = addr;
        p->pPrior = 0;
        pLimit = p->pLimit;
        p->pLimit = 0;
        intersectdest.iSDParm = tab2;
        ExplainQueryPlan((pParse, 1, "%s USING TEMP B-TREE",
                          sqlite3SelectOpName(p->op)));
        TREETRACE(0x400, pParse, p, ("multiSelect INTERSECT right...\n"));
        rc = sqlite3Select(pParse, p, &intersectdest);
        testcase( rc!=SQLITE_OK );
        pDelete = p->pPrior;
        p->pPrior = pPrior;
        if( p->nSelectRow>pPrior->nSelectRow ){
          p->nSelectRow = pPrior->nSelectRow;
        }
        sqlite3ExprDelete(db, p->pLimit);
        p->pLimit = pLimit;

        /* Generate code to take the intersection of the two temporary
        ** tables.
        */
        if( rc ) break;
        assert( p->pEList );
        iBreak = sqlite3VdbeMakeLabel(pParse);
        iCont = sqlite3VdbeMakeLabel(pParse);
        computeLimitRegisters(pParse, p, iBreak);
        sqlite3VdbeAddOp2(v, OP_Rewind, tab1, iBreak); VdbeCoverage(v);
        r1 = sqlite3GetTempReg(pParse);
        iStart = sqlite3VdbeAddOp2(v, OP_RowData, tab1, r1);
        sqlite3VdbeAddOp4Int(v, OP_NotFound, tab2, iCont, r1, 0);
        VdbeCoverage(v);
        sqlite3ReleaseTempReg(pParse, r1);
        selectInnerLoop(pParse, p, tab1,
                        0, 0, &dest, iCont, iBreak);
        sqlite3VdbeResolveLabel(v, iCont);
        sqlite3VdbeAddOp2(v, OP_Next, tab1, iStart); VdbeCoverage(v);
        sqlite3VdbeResolveLabel(v, iBreak);
        sqlite3VdbeAddOp2(v, OP_Close, tab2, 0);
        sqlite3VdbeAddOp2(v, OP_Close, tab1, 0);
        break;
      }
    }

  #ifndef SQLITE_OMIT_EXPLAIN
    if( p->pNext==0 ){
      ExplainQueryPlanPop(pParse);
    }
  #endif
  }
  if( pParse->nErr ) goto multi_select_end;

  /* Compute collating sequences used by
  ** temporary tables needed to implement the compound select.
  ** Attach the KeyInfo structure to all temporary tables.
  **
  ** This section is run by the right-most SELECT statement only.
  ** SELECT statements to the left always skip this part.  The right-most
  ** SELECT might also skip this part if it has no ORDER BY clause and
  ** no temp tables are required.
  */
  if( p->selFlags & SF_UsesEphemeral ){
    int i;                        /* Loop counter */
    KeyInfo *pKeyInfo;            /* Collating sequence for the result set */
    Select *pLoop;                /* For looping through SELECT statements */
    CollSeq **apColl;             /* For looping through pKeyInfo->aColl[] */
    int nCol;                     /* Number of columns in result set */

    assert( p->pNext==0 );
    assert( p->pEList!=0 );
    nCol = p->pEList->nExpr;
    pKeyInfo = sqlite3KeyInfoAlloc(db, nCol, 1);
    if( !pKeyInfo ){
      rc = SQLITE_NOMEM_BKPT;
      goto multi_select_end;
    }
    for(i=0, apColl=pKeyInfo->aColl; i<nCol; i++, apColl++){
      *apColl = multiSelectCollSeq(pParse, p, i);
      if( 0==*apColl ){
        *apColl = db->pDfltColl;
      }
    }

    for(pLoop=p; pLoop; pLoop=pLoop->pPrior){
      for(i=0; i<2; i++){
        int addr = pLoop->addrOpenEphm[i];
        if( addr<0 ){
          /* If [0] is unused then [1] is also unused.  So we can
          ** always safely abort as soon as the first unused slot is found */
          assert( pLoop->addrOpenEphm[1]<0 );
          break;
        }
        sqlite3VdbeChangeP2(v, addr, nCol);
        sqlite3VdbeChangeP4(v, addr, (char*)sqlite3KeyInfoRef(pKeyInfo),
                            P4_KEYINFO);
        pLoop->addrOpenEphm[i] = -1;
      }
    }
    sqlite3KeyInfoUnref(pKeyInfo);
  }

multi_select_end:
  pDest->iSdst = dest.iSdst;
  pDest->nSdst = dest.nSdst;
  if( pDelete ){
    sqlite3ParserAddCleanup(pParse, sqlite3SelectDeleteGeneric, pDelete);
  }
  return rc;
}